

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

Collision * __thiscall World::findNearestPrimitive(World *this,Ray *ray)

{
  bool bVar1;
  reference ppPVar2;
  undefined8 in_RDX;
  long in_RSI;
  Collision *in_RDI;
  Collision collision;
  Primitive *i;
  iterator __end1;
  iterator __begin1;
  vector<Primitive_*,_std::allocator<Primitive_*>_> *__range1;
  Collision *res;
  Collision *this_00;
  undefined1 local_a0 [8];
  Primitive *in_stack_ffffffffffffff68;
  Collision *in_stack_ffffffffffffff70;
  byte local_88;
  double local_50;
  __normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_> local_30;
  long local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  this_00 = in_RDI;
  local_18 = in_RDX;
  Collision::Collision(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this_00->crash = false;
  this_00->dist = 1e+50;
  local_28 = in_RSI + 0xd0;
  local_30._M_current =
       (Primitive **)
       std::vector<Primitive_*,_std::allocator<Primitive_*>_>::begin
                 ((vector<Primitive_*,_std::allocator<Primitive_*>_> *)in_RDI);
  std::vector<Primitive_*,_std::allocator<Primitive_*>_>::end
            ((vector<Primitive_*,_std::allocator<Primitive_*>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>
                             *)this_00,
                            (__normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>
                             *)in_RDI), bVar1) {
    ppPVar2 = __gnu_cxx::
              __normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>
              ::operator*(&local_30);
    (*(*ppPVar2)->_vptr_Primitive[2])(local_a0,*ppPVar2,local_18);
    if (((local_88 & 1) != 0) && (local_50 < this_00->dist)) {
      memcpy(this_00,local_a0,0x60);
    }
    Collision::~Collision(this_00);
    __gnu_cxx::
    __normal_iterator<Primitive_**,_std::vector<Primitive_*,_std::allocator<Primitive_*>_>_>::
    operator++(&local_30);
  }
  return in_RDI;
}

Assistant:

Collision World::findNearestPrimitive(const Ray &ray) {
    Collision res(nullptr);
    res.crash = false;
    res.dist = INF;
    for (auto i : pris) {
        Collision collision(i->collide(ray));
        if (collision.crash && collision.dist < res.dist)
            res = collision;
    }
    return res;
}